

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void * nk_draw_vertex(void *dst,nk_convert_config *config,nk_vec2 pos,nk_vec2 uv,nk_colorf color)

{
  nk_anti_aliasing value_count;
  ulong uVar1;
  nk_color nVar2;
  uint uVar3;
  uint uVar4;
  ulong in_RCX;
  long in_RDX;
  nk_size length;
  nk_colorf *src0;
  nk_vec2 *values;
  void *dst0;
  nk_vec2 *pnVar5;
  float fVar6;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined4 uVar21;
  undefined4 uVar27;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iVar34;
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  nk_color bgra;
  nk_colorf local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  nk_vec2 local_40;
  nk_vec2 local_38;
  
  fVar6 = config->global_alpha;
  if (fVar6 != 4.2039e-45) {
    pnVar5 = (nk_vec2 *)&config->arc_segment_count;
    local_78 = color;
    local_40 = uv;
    local_38 = pos;
    do {
      auVar10 = local_68;
      value_count = ((nk_convert_config *)(pnVar5 + -2))->line_AA;
      if (value_count == 0x13) break;
      dst0 = (void *)((long)(((nk_draw_null_texture *)(pnVar5 + -1))->texture).ptr + (long)dst);
      if (fVar6 == 0.0) {
        values = &local_38;
LAB_001206c2:
        nk_draw_vertex_element(dst0,&values->x,value_count,(nk_draw_vertex_layout_format)in_RCX);
        goto LAB_001206c7;
      }
      if (fVar6 != 1.4013e-45) {
        values = &local_40;
        if (fVar6 != 2.8026e-45) {
          __assert_fail("0 && \"wrong element attribute\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                        ,0x1feb,
                        "void *nk_draw_vertex(void *, const struct nk_convert_config *, struct nk_vec2, struct nk_vec2, struct nk_colorf)"
                       );
        }
        goto LAB_001206c2;
      }
      if (value_count < 8) {
        __assert_fail("format >= NK_FORMAT_COLOR_BEGIN",
                      "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                      ,0x1f68,
                      "void nk_draw_vertex_color(void *, const float *, enum nk_draw_vertex_layout_format)"
                     );
      }
      switch(value_count) {
      case 8:
      case 0xb:
      case 0x11:
      case 0x12:
        nVar2 = nk_rgba_f(local_78.r,local_78.g,local_78.b,local_78.a);
        goto LAB_001206a2;
      case 9:
        fVar6 = local_78.b * 65535.0;
        uVar3 = (fVar6 < 0.0 && fVar6 < 65535.0) - 1;
        uVar4 = (int)fVar6;
        if (65535.0 <= fVar6) {
          uVar4 = uVar3;
        }
        fVar14 = local_78.r * 65535.0;
        fVar15 = local_78.g * 65535.0;
        auVar19._4_4_ = -(uint)(65535.0 <= fVar15);
        auVar19._0_4_ = -(uint)(65535.0 <= fVar14);
        auVar19._8_4_ = 0xffffffff;
        auVar19._12_4_ = 0xffffffff;
        auVar31._0_4_ = (int)fVar14;
        auVar31._4_4_ = (int)fVar15;
        auVar31._8_8_ = 0;
        auVar11._4_4_ = -(uint)(fVar15 < 0.0);
        auVar11._0_4_ = -(uint)(fVar14 < 0.0);
        auVar11._8_8_ = 0;
        auVar24._0_4_ = -(uint)(fVar14 < 65535.0 && fVar14 < 0.0);
        auVar24._4_4_ = -(uint)(fVar15 < 65535.0 && fVar15 < 0.0);
        auVar24._8_4_ = auVar24._4_4_;
        auVar24._12_4_ = 0;
        auVar10 = packssdw(auVar11 | auVar19,auVar11 | auVar19);
        auVar18 = pshuflw(auVar19,auVar24 ^ _DAT_001582b0,0xe8);
        auVar23 = pshuflw(auVar24 ^ _DAT_001582b0,auVar31,0xe8);
        if (fVar6 < 0.0) {
          uVar4 = uVar3;
        }
        in_RCX = (ulong)uVar4;
        local_68._4_2_ = (short)uVar4;
        local_68._0_4_ = ~auVar10._0_4_ & auVar23._0_4_ | auVar18._0_4_ & auVar10._0_4_;
        length = 6;
        break;
      case 10:
        fVar6 = local_78.r * 4.2949673e+09;
        fVar14 = local_78.g * 4.2949673e+09;
        auVar13._0_4_ = (int)fVar6;
        auVar13._4_4_ = (int)fVar14;
        auVar13._8_8_ = 0;
        auVar32._0_4_ = auVar13._0_4_ >> 0x1f;
        auVar32._4_4_ = auVar13._4_4_ >> 0x1f;
        auVar32._8_8_ = 0;
        auVar12._0_4_ = (int)(fVar6 - 2.1474836e+09);
        auVar12._4_4_ = (int)(fVar14 - 2.1474836e+09);
        auVar12._8_4_ = 0x80000000;
        auVar12._12_4_ = 0x80000000;
        fVar15 = local_78.b * 4.2949673e+09;
        auVar13 = auVar12 & auVar32 | auVar13;
        in_RCX = 0;
        local_68._8_4_ = (undefined4)(long)fVar15;
        if (4.2949673e+09 <= fVar15) {
          local_68._8_4_ = 0;
        }
        local_68._4_4_ = ~-(uint)(fVar14 < 0.0 || 4.2949673e+09 <= fVar14) & auVar13._4_4_;
        local_68._0_4_ = ~-(uint)(fVar6 < 0.0 || 4.2949673e+09 <= fVar6) & auVar13._0_4_;
        if (fVar15 < 0.0) {
          local_68._8_4_ = 0;
        }
        local_68._12_4_ = auVar10._12_4_;
        length = 0xc;
        break;
      case 0xc:
        nVar2 = nk_rgba_f(local_78.r,local_78.g,local_78.b,local_78.a);
        uVar4 = (uint)nVar2 >> 0x10 & 0xff;
        in_RCX = (ulong)uVar4;
        nVar2 = (nk_color)((uint)nVar2 & 0xff00ff00 | ((uint)nVar2 & 0xff) << 0x10 | uVar4);
LAB_001206a2:
        local_68[0] = nVar2.r;
        local_68[1] = nVar2.g;
        local_68[2] = nVar2.b;
        local_68[3] = nVar2.a;
        length = 4;
        break;
      case 0xd:
        fVar6 = local_78.r * 65535.0;
        fVar14 = local_78.g * 65535.0;
        fVar15 = local_78.b * 65535.0;
        fVar16 = local_78.a * 65535.0;
        auVar17._4_4_ = -(uint)(65535.0 <= fVar14);
        auVar17._0_4_ = -(uint)(65535.0 <= fVar6);
        auVar17._8_4_ = -(uint)(65535.0 <= fVar15);
        auVar17._12_4_ = -(uint)(65535.0 <= fVar16);
        auVar30._0_4_ = (int)fVar6;
        auVar30._4_4_ = (int)fVar14;
        auVar30._8_4_ = (int)fVar15;
        auVar30._12_4_ = (int)fVar16;
        auVar9._4_4_ = -(uint)(fVar14 < 0.0);
        auVar9._0_4_ = -(uint)(fVar6 < 0.0);
        auVar9._8_4_ = -(uint)(fVar15 < 0.0);
        auVar9._12_4_ = -(uint)(fVar16 < 0.0);
        auVar22._0_4_ = -(uint)(fVar6 < 65535.0 && fVar6 < 0.0);
        auVar22._4_4_ = -(uint)(fVar14 < 65535.0 && fVar14 < 0.0);
        auVar22._8_4_ = -(uint)(fVar15 < 65535.0 && fVar15 < 0.0);
        auVar22._12_4_ = -(uint)(fVar16 < 65535.0 && fVar16 < 0.0);
        auVar23 = packssdw(auVar22,auVar22);
        auVar10 = packssdw(auVar9 | auVar17,auVar9 | auVar17);
        auVar18 = pshuflw(auVar17,auVar30,0xe8);
        auVar18 = pshufhw(auVar18,auVar18,0xe8);
        local_68._0_8_ =
             ~auVar10._0_8_ & CONCAT44(auVar18._8_4_,auVar18._0_4_) | ~auVar23._0_8_ & auVar10._0_8_
        ;
        length = 8;
        break;
      case 0xe:
        fVar6 = local_78.r * 4.2949673e+09;
        fVar14 = local_78.g * 4.2949673e+09;
        fVar15 = local_78.b * 4.2949673e+09;
        fVar16 = local_78.a * 4.2949673e+09;
        auVar8._0_4_ = (int)fVar6;
        auVar8._4_4_ = (int)fVar14;
        auVar8._8_4_ = (int)fVar15;
        auVar8._12_4_ = (int)fVar16;
        auVar29._0_4_ = auVar8._0_4_ >> 0x1f;
        auVar29._4_4_ = auVar8._4_4_ >> 0x1f;
        auVar29._8_4_ = auVar8._8_4_ >> 0x1f;
        auVar29._12_4_ = auVar8._12_4_ >> 0x1f;
        auVar7._0_4_ = (int)(fVar6 - 2.1474836e+09);
        auVar7._4_4_ = (int)(fVar14 - 2.1474836e+09);
        auVar7._8_4_ = (int)(fVar15 - 2.1474836e+09);
        auVar7._12_4_ = (int)(fVar16 - 2.1474836e+09);
        auVar8 = auVar7 & auVar29 | auVar8;
        local_68._0_4_ = ~-(uint)(fVar6 < 0.0 || 4.2949673e+09 <= fVar6) & auVar8._0_4_;
        local_68._4_4_ = ~-(uint)(fVar14 < 0.0 || 4.2949673e+09 <= fVar14) & auVar8._4_4_;
        local_68._8_4_ = ~-(uint)(fVar15 < 0.0 || 4.2949673e+09 <= fVar15) & auVar8._8_4_;
        local_68._12_4_ = ~-(uint)(fVar16 < 0.0 || 4.2949673e+09 <= fVar16) & auVar8._12_4_;
        length = 0x10;
        break;
      case 0xf:
        length = 0x10;
        src0 = &local_78;
        goto LAB_001206b3;
      case 0x10:
        auVar35._0_4_ = -(uint)(0.0 < local_78.r || 1.0 < local_78.r);
        iVar28 = -(uint)(0.0 < local_78.g || 1.0 < local_78.g);
        auVar35._4_4_ = auVar35._0_4_;
        auVar35._8_4_ = iVar28;
        auVar35._12_4_ = iVar28;
        iVar28 = -(uint)(local_78.r <= 0.0 || 1.0 < local_78.r);
        iVar34 = -(uint)(local_78.g <= 0.0 || 1.0 < local_78.g);
        auVar25._4_4_ = iVar28;
        auVar25._0_4_ = iVar28;
        auVar25._8_4_ = iVar34;
        auVar25._12_4_ = iVar34;
        auVar18._0_8_ = (double)local_78.r;
        auVar18._8_8_ = (double)local_78.g;
        local_68 = ~auVar25 & auVar18 | auVar35 & _DAT_00158250 & auVar25;
        auVar23._0_8_ = CONCAT44(-(uint)(1.0 < local_78.a),-(uint)(1.0 < local_78.b));
        auVar23._8_8_ = 0;
        auVar26._4_4_ = -(uint)(local_78.a <= 0.0);
        auVar26._0_4_ = -(uint)(local_78.b <= 0.0);
        auVar26._8_4_ = 0xffffffff;
        auVar26._12_4_ = 0xffffffff;
        uVar1 = CONCAT44(-(uint)(0.0 < local_78.a),-(uint)(0.0 < local_78.b)) | auVar23._0_8_;
        auVar33._0_4_ = (undefined4)uVar1;
        uVar21 = (undefined4)(uVar1 >> 0x20);
        auVar33._4_4_ = auVar33._0_4_;
        auVar33._8_4_ = uVar21;
        auVar33._12_4_ = uVar21;
        uVar21 = SUB164(auVar26 | auVar23,0);
        uVar27 = SUB164(auVar26 | auVar23,4);
        auVar20._4_4_ = uVar21;
        auVar20._0_4_ = uVar21;
        auVar20._8_4_ = uVar27;
        auVar20._12_4_ = uVar27;
        auVar10._0_8_ = (double)local_78.b;
        auVar10._8_8_ = (double)local_78.a;
        local_58 = ~auVar20 & auVar10 | auVar33 & _DAT_00158250 & auVar20;
        length = 0x20;
        break;
      default:
        __assert_fail("format <= NK_FORMAT_COLOR_END",
                      "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                      ,0x1f69,
                      "void nk_draw_vertex_color(void *, const float *, enum nk_draw_vertex_layout_format)"
                     );
      }
      src0 = (nk_colorf *)local_68;
LAB_001206b3:
      nk_memcopy(dst0,src0,length);
LAB_001206c7:
      fVar6 = pnVar5->x;
      pnVar5 = pnVar5 + 2;
    } while (fVar6 != 4.2039e-45);
  }
  return (void *)((long)dst + in_RDX);
}

Assistant:

NK_INTERN void*
nk_draw_vertex(void *dst, const struct nk_convert_config *config,
    struct nk_vec2 pos, struct nk_vec2 uv, struct nk_colorf color)
{
    void *result = (void*)((char*)dst + config->vertex_size);
    const struct nk_draw_vertex_layout_element *elem_iter = config->vertex_layout;
    while (!nk_draw_vertex_layout_element_is_end_of_layout(elem_iter)) {
        void *address = (void*)((char*)dst + elem_iter->offset);
        switch (elem_iter->attribute) {
        case NK_VERTEX_ATTRIBUTE_COUNT:
        default: NK_ASSERT(0 && "wrong element attribute");
        case NK_VERTEX_POSITION: nk_draw_vertex_element(address, &pos.x, 2, elem_iter->format); break;
        case NK_VERTEX_TEXCOORD: nk_draw_vertex_element(address, &uv.x, 2, elem_iter->format); break;
        case NK_VERTEX_COLOR: nk_draw_vertex_color(address, &color.r, elem_iter->format); break;
        }
        elem_iter++;
    }
    return result;
}